

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.cc
# Opt level: O3

void __thiscall
message_test_should_extend_message_properly_Test::~message_test_should_extend_message_properly_Test
          (message_test_should_extend_message_properly_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(message_test, should_extend_message_properly)
{
    using MyTag = Fixpp::TagT<2154, Fixpp::Type::Int>;
    using MyMessage = Fixpp::ExtendedMessage<Fixpp::v42::Message::Logon, MyTag>;

    static constexpr size_t LogonTags = Fixpp::v42::Message::Logon::TotalTags;
    static constexpr size_t MyMessageTags = MyMessage::TotalTags;

    // MyMessage should have one more tag
    ASSERT_EQ(MyMessageTags, LogonTags + 1);

    // Last tag of MyMessage should by MyTag
    using LastMyMessageTag =
        meta::typelist::ops::Last<MyMessage::List>::Result;

    static constexpr size_t LastMyMessageTagId = LastMyMessageTag::Id;
    ASSERT_EQ(LastMyMessageTagId, 2154);

    // First tag of MymEssage should by first tag of Logon
    using FirstLogonTag =
        meta::typelist::ops::First<Fixpp::v42::Message::Logon::TagsList>::Result;
    using FirstMyMessageTag =
        meta::typelist::ops::First<MyMessage::TagsList>::Result;

    static constexpr size_t FirstLogonTagId = FirstLogonTag::Id;
    static constexpr size_t FirstMyMessageTagId = FirstMyMessageTag::Id;
    ASSERT_EQ(FirstLogonTagId, FirstMyMessageTagId);
}